

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[10],_char[4608],_char[5],_char[10]>
* __thiscall
fmt::v9::
make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const(&)[10],char(&)[4608],char_const(&)[5],char_const(&)[10]>
          (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[10],_char[4608],_char[5],_char[10]>
           *__return_storage_ptr__,v9 *this,char (*args) [10],char (*args_1) [4608],
          char (*args_2) [5],char (*args_3) [10])

{
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  char_type **arg_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  char_type **arg_2;
  size_t local_1e0;
  size_t local_130;
  size_t local_e0;
  size_t local_90;
  char (*args_local_3) [10];
  char (*args_local_2) [5];
  char (*args_local_1) [4608];
  char (*args_local) [10];
  
  (__return_storage_ptr__->data_).args_[0].field_0.named_args.data = (named_arg_info<char> *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_130;
  (__return_storage_ptr__->data_).args_[1].field_0.pointer = args;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_1e0;
  (__return_storage_ptr__->data_).args_[2].field_0.pointer = args_1;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_90;
  (__return_storage_ptr__->data_).args_[3].field_0.pointer = args_2;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_e0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}